

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normal_compression_utils.h
# Opt level: O2

void __thiscall
draco::OctahedronToolBox::InvertDiamond(OctahedronToolBox *this,int32_t *s,int32_t *t)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  
  iVar1 = *s;
  iVar2 = *t;
  if (iVar1 < 0) {
    iVar6 = -1;
    iVar7 = iVar6;
    if (iVar2 < 1) goto LAB_00158635;
  }
  else {
    if (-1 < iVar2) {
      iVar6 = 1;
      iVar7 = iVar6;
      goto LAB_00158635;
    }
    if (iVar1 == 0) {
      iVar6 = -1;
      iVar7 = iVar6;
      goto LAB_00158635;
    }
    iVar6 = 1;
  }
  iVar7 = (uint)(0 < iVar2) * 2 + -1;
LAB_00158635:
  iVar8 = this->center_value_ * iVar6;
  iVar5 = this->center_value_ * iVar7;
  iVar3 = iVar1 * 2 - iVar8;
  iVar4 = iVar2 * 2 - iVar5;
  iVar1 = -iVar3;
  iVar2 = -iVar4;
  if (iVar6 * iVar7 < 0) {
    iVar1 = iVar3;
    iVar2 = iVar4;
  }
  *s = iVar2 + iVar8;
  *t = iVar1 + iVar5;
  *s = *s / 2;
  *t = *t / 2;
  return;
}

Assistant:

void InvertDiamond(int32_t *s, int32_t *t) const {
    // Expect center already at origin.
    DRACO_DCHECK_LE(*s, center_value_);
    DRACO_DCHECK_LE(*t, center_value_);
    DRACO_DCHECK_GE(*s, -center_value_);
    DRACO_DCHECK_GE(*t, -center_value_);
    int32_t sign_s = 0;
    int32_t sign_t = 0;
    if (*s >= 0 && *t >= 0) {
      sign_s = 1;
      sign_t = 1;
    } else if (*s <= 0 && *t <= 0) {
      sign_s = -1;
      sign_t = -1;
    } else {
      sign_s = (*s > 0) ? 1 : -1;
      sign_t = (*t > 0) ? 1 : -1;
    }

    // Perform the addition and subtraction using unsigned integers to avoid
    // signed integer overflows for bad data. Note that the result will be
    // unchanged for non-overflowing cases.
    const uint32_t corner_point_s = sign_s * center_value_;
    const uint32_t corner_point_t = sign_t * center_value_;
    uint32_t us = *s;
    uint32_t ut = *t;
    us = us + us - corner_point_s;
    ut = ut + ut - corner_point_t;
    if (sign_s * sign_t >= 0) {
      uint32_t temp = us;
      us = -ut;
      ut = -temp;
    } else {
      std::swap(us, ut);
    }
    us = us + corner_point_s;
    ut = ut + corner_point_t;

    *s = us;
    *t = ut;
    *s /= 2;
    *t /= 2;
  }